

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

int str_format(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  size_t l_00;
  char *pcVar3;
  lua_Number lVar4;
  char *s;
  size_t l;
  char buff [512];
  char form [18];
  luaL_Buffer b;
  char *strfrmt_end;
  char *strfrmt;
  size_t sfl;
  lua_State *plStack_18;
  int arg;
  lua_State *L_local;
  
  sfl._4_4_ = 1;
  plStack_18 = L;
  strfrmt_end = luaL_checklstring(L,1,(size_t *)&strfrmt);
  b.buffer._8184_8_ = strfrmt_end + (long)strfrmt;
  luaL_buffinit(plStack_18,(luaL_Buffer *)(form + 0x10));
LAB_0011ada6:
  while( true ) {
    while( true ) {
      if ((ulong)b.buffer._8184_8_ <= strfrmt_end) {
        luaL_pushresult((luaL_Buffer *)(form + 0x10));
        return 1;
      }
      if (*strfrmt_end == '%') break;
      if (b.buffer + 0x1ff8 <= stack0xffffffffffffdfb0) {
        luaL_prepbuffer((luaL_Buffer *)(form + 0x10));
      }
      *stack0xffffffffffffdfb0 = *strfrmt_end;
      unique0x10000381 = stack0xffffffffffffdfb0 + 1;
      strfrmt_end = strfrmt_end + 1;
    }
    pcVar3 = strfrmt_end + 1;
    if (strfrmt_end[1] != '%') break;
    if (b.buffer + 0x1ff8 <= stack0xffffffffffffdfb0) {
      luaL_prepbuffer((luaL_Buffer *)(form + 0x10));
    }
    strfrmt_end = strfrmt_end + 2;
    *stack0xffffffffffffdfb0 = *pcVar3;
    unique0x10000389 = stack0xffffffffffffdfb0 + 1;
  }
  sfl._4_4_ = sfl._4_4_ + 1;
  pcVar3 = scanformat(plStack_18,pcVar3,buff + 0x1f8);
  strfrmt_end = pcVar3 + 1;
  switch(*pcVar3) {
  case 'E':
  case 'G':
  case 'e':
  case 'f':
  case 'g':
    luaL_checknumber(plStack_18,sfl._4_4_);
    sprintf((char *)&l,buff + 0x1f8);
    break;
  default:
    iVar1 = luaL_error(plStack_18,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)*pcVar3)
    ;
    return iVar1;
  case 'X':
  case 'o':
  case 'u':
  case 'x':
    addintlen(buff + 0x1f8);
    lVar4 = luaL_checknumber(plStack_18,sfl._4_4_);
    sprintf((char *)&l,buff + 0x1f8,
            (long)lVar4 | (long)(lVar4 - 9.223372036854776e+18) & (long)lVar4 >> 0x3f);
    break;
  case 'c':
    lVar4 = luaL_checknumber(plStack_18,sfl._4_4_);
    sprintf((char *)&l,buff + 0x1f8,(ulong)(uint)(int)lVar4);
    break;
  case 'd':
  case 'i':
    addintlen(buff + 0x1f8);
    lVar4 = luaL_checknumber(plStack_18,sfl._4_4_);
    sprintf((char *)&l,buff + 0x1f8,(long)lVar4);
    break;
  case 'q':
    addquoted(plStack_18,(luaL_Buffer *)(form + 0x10),sfl._4_4_);
    goto LAB_0011ada6;
  case 's':
    pcVar3 = luaL_checklstring(plStack_18,sfl._4_4_,(size_t *)&s);
    pcVar2 = strchr(buff + 0x1f8,0x2e);
    if ((pcVar2 != (char *)0x0) || (s < (char *)0x64)) {
      sprintf((char *)&l,buff + 0x1f8,pcVar3);
      break;
    }
    lua_pushvalue(plStack_18,sfl._4_4_);
    luaL_addvalue((luaL_Buffer *)(form + 0x10));
    goto LAB_0011ada6;
  }
  l_00 = strlen((char *)&l);
  luaL_addlstring((luaL_Buffer *)(form + 0x10),(char *)&l,l_00);
  goto LAB_0011ada6;
}

Assistant:

static int str_format (lua_State *L) {
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format (`%...') */
      char buff[MAX_ITEM];  /* to store the formatted item */
      arg++;
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          sprintf(buff, form, (int)luaL_checknumber(L, arg));
          break;
        }
        case 'd':  case 'i': {
          addintlen(form);
          sprintf(buff, form, (LUA_INTFRM_T)luaL_checknumber(L, arg));
          break;
        }
        case 'o':  case 'u':  case 'x':  case 'X': {
          addintlen(form);
          sprintf(buff, form, (unsigned LUA_INTFRM_T)luaL_checknumber(L, arg));
          break;
        }
        case 'e':  case 'E': case 'f':
        case 'g': case 'G': {
          sprintf(buff, form, (double)luaL_checknumber(L, arg));
          break;
        }
        case 'q': {
          addquoted(L, &b, arg);
          continue;  /* skip the 'addsize' at the end */
        }
        case 's': {
          size_t l;
          const char *s = luaL_checklstring(L, arg, &l);
          if (!strchr(form, '.') && l >= 100) {
            /* no precision and string is too long to be formatted;
               keep original string */
            lua_pushvalue(L, arg);
            luaL_addvalue(&b);
            continue;  /* skip the `addsize' at the end */
          }
          else {
            sprintf(buff, form, s);
            break;
          }
        }
        default: {  /* also treat cases `pnLlh' */
          return luaL_error(L, "invalid option " LUA_QL("%%%c") " to "
                               LUA_QL("format"), *(strfrmt - 1));
        }
      }
      luaL_addlstring(&b, buff, strlen(buff));
    }
  }
  luaL_pushresult(&b);
  return 1;
}